

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
cbor_event_reader<std::__cxx11::istringstream&>
          (cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_8;
  
  local_8 = 0x400;
  local_18 = 0x999f30;
  local_10 = 0x999f58;
  cbor_event_reader<std::__cxx11::istringstream&>(this,&local_19,source,&local_18,ec);
  return;
}

Assistant:

cbor_event_reader(Sourceable&& source, std::error_code& ec)
            : cbor_event_reader(std::allocator_arg, Allocator(),
                  std::forward<Sourceable>(source), 
                  cbor_decode_options(), 
                  ec)
        {
        }